

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.cpp
# Opt level: O0

Expr * hsql::Expr::makeFunctionRef
                 (char *func_name,vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *exprList,
                 bool distinct)

{
  Expr *this;
  Expr *e;
  bool distinct_local;
  vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *exprList_local;
  char *func_name_local;
  
  this = (Expr *)operator_new(0x60);
  Expr(this,kExprFunctionRef);
  this->name = func_name;
  this->exprList = exprList;
  this->distinct = distinct;
  return this;
}

Assistant:

Expr* Expr::makeFunctionRef(char* func_name, std::vector<Expr*>* exprList, bool distinct) {
    Expr* e = new Expr(kExprFunctionRef);
    e->name = func_name;
    e->exprList = exprList;
    e->distinct = distinct;
    return e;
  }